

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O3

int curl_formget(curl_httppost *form,void *arg,curl_formget_callback append)

{
  CURLcode CVar1;
  size_t sVar2;
  size_t sVar3;
  curl_mimepart toppart;
  char buffer [8192];
  curl_mimepart cStack_21f8;
  char local_2038 [8200];
  
  Curl_mime_initpart(&cStack_21f8,(Curl_easy *)0x0);
  CVar1 = Curl_getformdata((Curl_easy *)0x0,&cStack_21f8,form,(curl_read_callback)0x0);
  if ((CVar1 == CURLE_OK) &&
     (CVar1 = Curl_mime_prepare_headers
                        (&cStack_21f8,"multipart/form-data",(char *)0x0,MIMESTRATEGY_FORM),
     CVar1 == CURLE_OK)) {
    do {
      do {
        sVar2 = Curl_mime_read(local_2038,1,0x2000,&cStack_21f8);
      } while (sVar2 - 0x10000000 < 2);
      if (sVar2 == 0) {
        CVar1 = CURLE_OK;
        goto LAB_0010d696;
      }
      sVar3 = (*append)(arg,local_2038,sVar2);
    } while (sVar3 == sVar2);
    CVar1 = CURLE_READ_ERROR;
  }
LAB_0010d696:
  Curl_mime_cleanpart(&cStack_21f8);
  return CVar1;
}

Assistant:

int curl_formget(struct curl_httppost *form, void *arg,
                 curl_formget_callback append)
{
  CURLcode result;
  curl_mimepart toppart;

  Curl_mime_initpart(&toppart, NULL); /* default form is empty */
  result = Curl_getformdata(NULL, &toppart, form, NULL);
  if(!result)
    result = Curl_mime_prepare_headers(&toppart, "multipart/form-data",
                                       NULL, MIMESTRATEGY_FORM);

  while(!result) {
    char buffer[8192];
    size_t nread = Curl_mime_read(buffer, 1, sizeof(buffer), &toppart);

    if(!nread)
      break;

    switch(nread) {
    default:
      if(append(arg, buffer, nread) != nread)
        result = CURLE_READ_ERROR;
      break;
    case CURL_READFUNC_ABORT:
    case CURL_READFUNC_PAUSE:
      break;
    }
  }

  Curl_mime_cleanpart(&toppart);
  return (int) result;
}